

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::get_options
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true> *this)

{
  bool bVar1;
  Display DVar2;
  long in_RSI;
  Machine local_20;
  undefined4 local_14;
  
  local_14 = 1;
  std::make_unique<Apple::II::Machine::Options,Configurable::OptionsType>((OptionsType *)&local_20);
  DVar2 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0x28))
  ;
  *(Display *)(local_20._vptr_Machine + 1) = DVar2;
  bVar1 = II::Video::VideoBase::get_use_square_pixels((VideoBase *)(in_RSI + 0xdd0));
  *(bool *)((long)local_20._vptr_Machine + 0xc) = bVar1;
  (this->super_Machine)._vptr_Machine = local_20._vptr_Machine;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() final {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			options->use_square_pixels = video_.get_use_square_pixels();
			return options;
		}